

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O0

uint64_t nanovdb::io::stringHash(char *cstr)

{
  uint64_t overflow;
  uchar *str;
  uint64_t hash;
  char *cstr_local;
  uint64_t local_8;
  
  hash = 0;
  str = (uchar *)cstr;
  if (cstr == (char *)0x0) {
    local_8 = 0;
  }
  else {
    for (; *str != '\0'; str = str + 1) {
      hash = (ulong)*str + (hash >> 0x38) + hash * 0x43;
    }
    local_8 = hash;
  }
  return local_8;
}

Assistant:

inline uint64_t stringHash(const char* cstr)
{
    uint64_t hash = 0;
    if (!cstr) {
        return hash;
    }
    for (auto* str = reinterpret_cast<const unsigned char*>(cstr); *str; ++str) {
        uint64_t overflow = hash >> (64 - 8);
        hash *= 67; // Next-ish prime after 26 + 26 + 10
        hash += *str + overflow;
    }
    return hash;
}